

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O3

void llvm::write_integer(raw_ostream *S,longlong N,size_t MinDigits,IntegerStyle Style)

{
  if (-1 < N) {
    write_unsigned<unsigned_long_long>(S,N,MinDigits,Style,false);
    return;
  }
  write_unsigned<unsigned_long_long>(S,-N,MinDigits,Style,true);
  return;
}

Assistant:

static void write_signed(raw_ostream &S, T N, size_t MinDigits,
                         IntegerStyle Style) {
  static_assert(std::is_signed<T>::value, "Value is not signed!");

  using UnsignedT = typename std::make_unsigned<T>::type;

  if (N >= 0) {
    write_unsigned(S, static_cast<UnsignedT>(N), MinDigits, Style);
    return;
  }

  UnsignedT UN = -(UnsignedT)N;
  write_unsigned(S, UN, MinDigits, Style, true);
}